

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZMultiphysicsElement_*,_7>::~TPZManVector
          (TPZManVector<TPZMultiphysicsElement_*,_7> *this)

{
  TPZMultiphysicsElement **ppTVar1;
  
  ppTVar1 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore;
  if (ppTVar1 == this->fExtAlloc) {
    (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore = (TPZMultiphysicsElement **)0x0;
    (this->super_TPZVec<TPZMultiphysicsElement_*>).fNAlloc = 0;
    (this->super_TPZVec<TPZMultiphysicsElement_*>)._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_019e0e90;
  }
  else {
    (this->super_TPZVec<TPZMultiphysicsElement_*>).fNAlloc = 0;
    (this->super_TPZVec<TPZMultiphysicsElement_*>)._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_019e0e90;
    if (ppTVar1 != (TPZMultiphysicsElement **)0x0) {
      operator_delete__(ppTVar1);
      return;
    }
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}